

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::
~BasicBufferCase(BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

BasicBufferCase<SampleType>::~BasicBufferCase (void)
{
	deinit();
}